

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::ColorQuant::Node::destroy(Node *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  long lVar3;
  
  for (lVar3 = 4; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    if (this->children[lVar3 + -4] != (Node *)0x0) {
      destroy(this->children[lVar3 + -4]);
    }
  }
  pLVar1 = (this->link).next;
  if (pLVar1 != (LLLink *)0x0) {
    pLVar2 = (this->link).prev;
    pLVar2->next = pLVar1;
    pLVar1->prev = pLVar2;
  }
  (*DAT_00144da0)(this);
  return;
}

Assistant:

void
ColorQuant::Node::destroy(void)
{
	int i;
	for(i = 0; i < 16; i++)
		if(this->children[i])
			this->children[i]->destroy();
	if(this->link.next)
		this->link.remove();
	rwFree(this);
}